

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprNeedsNoAffinityChange(Expr *p,char aff)

{
  bool bVar1;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21;
  u8 local_1a;
  u8 op;
  Expr *pEStack_18;
  char aff_local;
  Expr *p_local;
  
  pEStack_18 = p;
  if (aff == 'A') {
    p_local._4_4_ = 1;
  }
  else {
    while( true ) {
      bVar1 = true;
      if (pEStack_18->op != 0x9c) {
        bVar1 = pEStack_18->op == 0x9b;
      }
      if (!bVar1) break;
      pEStack_18 = pEStack_18->pLeft;
    }
    local_1a = pEStack_18->op;
    if (local_1a == 0x9d) {
      local_1a = pEStack_18->op2;
    }
    if (local_1a == 'a') {
      p_local._4_4_ = (uint)(aff == 'B');
    }
    else if (local_1a == 0x84) {
      local_22 = aff == 'E' || aff == 'C';
      p_local._4_4_ = (uint)local_22;
    }
    else if (local_1a == 0x85) {
      p_local._4_4_ = 1;
    }
    else if (local_1a == 0x86) {
      local_21 = aff == 'D' || aff == 'C';
      p_local._4_4_ = (uint)local_21;
    }
    else if (local_1a == 0x98) {
      local_23 = false;
      if (pEStack_18->iColumn < 0) {
        local_24 = aff == 'D' || aff == 'C';
        local_23 = local_24;
      }
      p_local._4_4_ = (uint)local_23;
    }
    else {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprNeedsNoAffinityChange(const Expr *p, char aff){
  u8 op;
  if( aff==SQLITE_AFF_BLOB ) return 1;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){ p = p->pLeft; }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER: {
      return aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_FLOAT: {
      return aff==SQLITE_AFF_REAL || aff==SQLITE_AFF_NUMERIC;
    }
    case TK_STRING: {
      return aff==SQLITE_AFF_TEXT;
    }
    case TK_BLOB: {
      return 1;
    }
    case TK_COLUMN: {
      assert( p->iTable>=0 );  /* p cannot be part of a CHECK constraint */
      return p->iColumn<0
          && (aff==SQLITE_AFF_INTEGER || aff==SQLITE_AFF_NUMERIC);
    }
    default: {
      return 0;
    }
  }
}